

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

bool __thiscall
QOpenGLShaderProgram::addShaderFromSourceFile
          (QOpenGLShaderProgram *this,ShaderType type,QString *fileName)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QString *fileName_00;
  EVP_PKEY_CTX *in_RSI;
  QOpenGLShaderProgram *in_RDI;
  long in_FS_OFFSET;
  double __x;
  QOpenGLShader *shader;
  QOpenGLShaderProgramPrivate *d;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QObject *in_stack_ffffffffffffff98;
  bool local_29;
  QOpenGLShader local_28;
  QOpenGLShader *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QOpenGLShaderProgram *)0x173783);
  uVar3 = init(in_RDI,in_RSI);
  if ((uVar3 & 1) == 0) {
    local_29 = false;
  }
  else {
    fileName_00 = (QString *)operator_new(0x10);
    QOpenGLShader::QOpenGLShader
              ((QOpenGLShader *)fileName_00,
               (QFlagsStorageHelper<QOpenGLShader::ShaderTypeBit,_4>)SUB84((ulong)in_RDI >> 0x20,0),
               in_stack_ffffffffffffff98);
    bVar2 = QOpenGLShader::compileSourceFile((QOpenGLShader *)in_RDI,fileName_00);
    if (bVar2) {
      QList<QOpenGLShader_*>::append
                ((QList<QOpenGLShader_*> *)0x17384c,(parameter_type)in_stack_ffffffffffffff88);
      local_29 = addShader((QOpenGLShaderProgram *)fileName_00,in_stack_ffffffffffffffe8);
    }
    else {
      QOpenGLShader::log(&local_28,__x);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x173814);
      if (fileName_00 != (QString *)0x0) {
        (**(code **)&(fileName_00->d).d[2].super_QArrayData)();
      }
      local_29 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShaderFromSourceFile
    (QOpenGLShader::ShaderType type, const QString& fileName)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    QOpenGLShader *shader = new QOpenGLShader(type, this);
    if (!shader->compileSourceFile(fileName)) {
        d->log = shader->log();
        delete shader;
        return false;
    }
    d->anonShaders.append(shader);
    return addShader(shader);
}